

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void pegmatite::defaultErrorReporter(InputRange *ir,string *message)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error at ",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(ir->start).line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ir->finish).col);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void defaultErrorReporter(const InputRange& ir, const std::string& message)
{
	std::cerr
		<< "error at " << ir.start.line << ":" << ir.finish.col
		<< ": " << message << std::endl
		;
}